

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory_basketball_factory.cpp
# Opt level: O0

shared_ptr<abstract_factory::IBall> __thiscall
abstract_factory::BasketballAbstractFactory::GetBall(BasketballAbstractFactory *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<abstract_factory::IBall> sVar1;
  shared_ptr<abstract_factory::Basketball> local_28;
  BasketballAbstractFactory *this_local;
  
  this_local = this;
  std::make_shared<abstract_factory::Basketball>();
  std::shared_ptr<abstract_factory::IBall>::shared_ptr<abstract_factory::Basketball,void>
            ((shared_ptr<abstract_factory::IBall> *)this,&local_28);
  std::shared_ptr<abstract_factory::Basketball>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<abstract_factory::IBall,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<abstract_factory::IBall,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<abstract_factory::IBall>)
         sVar1.super___shared_ptr<abstract_factory::IBall,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IBall> BasketballAbstractFactory::GetBall() {
    return std::shared_ptr<IBall>{std::make_shared<Basketball>()};
}